

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

NaVector * __thiscall NaVector::shift(NaVector *this,int iOffset)

{
  int iVar1;
  int iVar2;
  NaReal *pNVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  if ((iOffset < iVar1) && (iVar1 = (*this->_vptr_NaVector[6])(this), -iVar1 < iOffset)) {
    if (iOffset < 1) {
      if (iOffset < 0) {
        iVar1 = (*this->_vptr_NaVector[6])(this);
        if (iVar1 + iOffset != 0 && SCARRY4(iVar1,iOffset) == iVar1 + iOffset < 0) {
          lVar5 = 0;
          do {
            this->pVect[lVar5] = this->pVect[lVar5 - iOffset];
            lVar5 = lVar5 + 1;
            iVar1 = (*this->_vptr_NaVector[6])(this);
          } while (lVar5 < iVar1 + iOffset);
        }
        iVar1 = (*this->_vptr_NaVector[6])(this);
        iVar2 = (*this->_vptr_NaVector[6])(this);
        if (iVar1 + iOffset < iVar2) {
          lVar5 = (long)(iVar1 + iOffset);
          do {
            this->pVect[lVar5] = 0.0;
            lVar5 = lVar5 + 1;
            iVar1 = (*this->_vptr_NaVector[6])(this);
          } while (lVar5 < iVar1);
        }
      }
    }
    else {
      iVar1 = (*this->_vptr_NaVector[6])(this);
      if (-1 < ~iOffset + iVar1) {
        pNVar3 = this->pVect + (uint)(~iOffset + iVar1);
        iVar1 = iVar1 - iOffset;
        do {
          pNVar3[(uint)iOffset] = *pNVar3;
          pNVar3 = pNVar3 + -1;
          iVar1 = iVar1 + -1;
        } while (0 < iVar1);
      }
      uVar4 = 1;
      if (1 < iOffset) {
        uVar4 = (ulong)(uint)iOffset;
      }
      memset(this->pVect,0,uVar4 << 3);
    }
  }
  else {
    (*this->_vptr_NaVector[0xd])(this);
  }
  return this;
}

Assistant:

NaVector&
NaVector::shift (int iOffset)
{
    int i;

    if(iOffset >= (int)dim() ||
       iOffset <= - (int)dim()){
       init_zero();
    }else if(iOffset > 0){
        for(i = dim() - iOffset - 1; i >= 0; --i){
            pVect[i + iOffset] = pVect[i];
        }
        for(i = 0; i < iOffset; ++i){
            pVect[i] = 0.0;
        }
    }else if(iOffset < 0){
        for(i = 0; i < (int)dim() + iOffset; ++i){
            pVect[i] = pVect[i - iOffset];
        }
        for(i = dim() + iOffset; i < (int)dim(); ++i){
            pVect[i] = 0.0;
        }
    }
    // else
    //   iOffset == 0
    
    return *this;
}